

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TilePool.cpp
# Opt level: O1

size_t __thiscall TilePool::allocateSector(TilePool *this)

{
  bitset<64UL> *pbVar1;
  uint uVar2;
  pointer puVar3;
  __uniq_ptr_data<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>,_true,_true> _Var4;
  ulong uVar5;
  iterator __position;
  source_loc loc;
  source_loc loc_00;
  size_t in_RAX;
  logger *plVar6;
  long lVar7;
  pointer puVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  string_view_t fmt;
  string_view_t fmt_00;
  unsigned_long local_60;
  _Head_base<0UL,_TilePool::PoolItem_*,_false> local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  unsigned_long local_40;
  unsigned_long local_38;
  
  local_60 = 0;
  puVar8 = (this->itemsAllocatedCount_).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar13 = (this->itemsAllocatedCount_).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish != puVar8;
  if (bVar13) {
    do {
      uVar2 = puVar8[local_60];
      if (uVar2 < 0x40) {
        puVar3 = (this->items_).
                 super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        _Var4.super___uniq_ptr_impl<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>.
        _M_t.super__Tuple_impl<0UL,_TilePool::PoolItem_*,_std::default_delete<TilePool::PoolItem>_>.
        super__Head_base<0UL,_TilePool::PoolItem_*,_false>._M_head_impl =
             puVar3[local_60]._M_t.
             super___uniq_ptr_impl<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>;
        uVar5 = *(ulong *)((long)_Var4.
                                 super___uniq_ptr_impl<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_TilePool::PoolItem_*,_std::default_delete<TilePool::PoolItem>_>
                                 .super__Head_base<0UL,_TilePool::PoolItem_*,_false>._M_head_impl +
                          0x1030);
        if ((uVar5 & 1) == 0) {
          uVar9 = 1;
          uVar11 = 0;
          bVar12 = false;
        }
        else {
          uVar11 = 0;
          do {
            uVar10 = uVar11;
            bVar12 = 0x3e < uVar10;
            if (uVar10 == 0x3f) goto LAB_0017735e;
            uVar9 = 2L << ((byte)uVar10 & 0x3f);
            uVar11 = uVar10 + 1;
          } while ((uVar5 & uVar9) != 0);
          bVar12 = 0x3e < uVar10;
        }
        *(ulong *)((long)_Var4.
                         super___uniq_ptr_impl<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_TilePool::PoolItem_*,_std::default_delete<TilePool::PoolItem>_>
                         .super__Head_base<0UL,_TilePool::PoolItem_*,_false>._M_head_impl + 0x1030)
             = uVar5 | uVar9;
        puVar8[local_60] = uVar2 + 1;
        local_40 = local_60 * 0x40 + uVar11;
        local_38 = (long)(this->items_).
                         super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3;
        plVar6 = spdlog::default_logger_raw();
        local_58._M_head_impl = (PoolItem *)0x0;
        uStack_50 = 0;
        local_48 = 0;
        loc.funcname = (char *)0x0;
        loc.filename = (char *)0x0;
        loc.line = 0;
        loc._12_4_ = 0;
        fmt.size_ = 0x3d;
        fmt.data_ = "TilePool allocating sector {} at index {} (items size is {}).";
        spdlog::logger::log_<unsigned_long,unsigned_long&,unsigned_long>
                  (plVar6,loc,debug,fmt,&local_40,&local_60,&local_38);
        in_RAX = local_60 * 0x40 + uVar11;
LAB_0017735e:
        if (!bVar12) break;
      }
      local_60 = local_60 + 1;
      puVar8 = (this->itemsAllocatedCount_).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar13 = local_60 <
               (ulong)((long)(this->itemsAllocatedCount_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)puVar8 >> 2);
    } while (bVar13);
  }
  if (!bVar13) {
    details::make_unique<TilePool::PoolItem,_0>();
    std::
    vector<std::unique_ptr<TilePool::PoolItem,std::default_delete<TilePool::PoolItem>>,std::allocator<std::unique_ptr<TilePool::PoolItem,std::default_delete<TilePool::PoolItem>>>>
    ::emplace_back<std::unique_ptr<TilePool::PoolItem,std::default_delete<TilePool::PoolItem>>>
              ((vector<std::unique_ptr<TilePool::PoolItem,std::default_delete<TilePool::PoolItem>>,std::allocator<std::unique_ptr<TilePool::PoolItem,std::default_delete<TilePool::PoolItem>>>>
                *)this,(unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_> *)
                       &local_58);
    if (local_58._M_head_impl != (PoolItem *)0x0) {
      std::default_delete<TilePool::PoolItem>::operator()
                ((default_delete<TilePool::PoolItem> *)&local_58,local_58._M_head_impl);
    }
    pbVar1 = &((this->items_).
               super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>.
               _M_t.
               super__Tuple_impl<0UL,_TilePool::PoolItem_*,_std::default_delete<TilePool::PoolItem>_>
               .super__Head_base<0UL,_TilePool::PoolItem_*,_false>._M_head_impl)->allocated;
    (pbVar1->super__Base_bitset<1UL>)._M_w = (pbVar1->super__Base_bitset<1UL>)._M_w | 1;
    local_58._M_head_impl._0_4_ = 1;
    __position._M_current =
         (this->itemsAllocatedCount_).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->itemsAllocatedCount_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&this->itemsAllocatedCount_,__position,(uint *)&local_58);
    }
    else {
      *__position._M_current = 1;
      (this->itemsAllocatedCount_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    lVar7 = (long)(this->items_).
                  super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->items_).
                  super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_60 = lVar7 * 8 - 0x40;
    local_40 = lVar7 >> 3;
    plVar6 = spdlog::default_logger_raw();
    local_58._M_head_impl = (PoolItem *)0x0;
    uStack_50 = 0;
    local_48 = 0;
    loc_00.funcname = (char *)0x0;
    loc_00.filename = (char *)0x0;
    loc_00.line = 0;
    loc_00._12_4_ = 0;
    fmt_00.size_ = 0x38;
    fmt_00.data_ = "TilePool allocating sector {} at end (items size is {}).";
    spdlog::logger::log_<unsigned_long,unsigned_long>
              (plVar6,loc_00,debug,fmt_00,&local_60,&local_40);
    in_RAX = ((long)(this->items_).
                    super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->items_).
                   super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) * 8 - 0x40;
  }
  return in_RAX;
}

Assistant:

size_t TilePool::allocateSector() {
    /*++upperId_;
    const auto itemIndex = static_cast<size_t>((upperId_ - baseId_) / CHUNK_AREA);
    if (itemIndex == items_.size()) {
        items_.emplace_back(details::make_unique<PoolItem>());
    }
    //spdlog::debug("TilePool allocating id {} at index {} (items size is {}).", upperId_, itemIndex, items_.size());

    PoolItem* item = items_[itemIndex].get();
    item->allocated.set(upperId_ % CHUNK_AREA);
    ++item->allocatedCount;
    return {
        item->chunk.accessTile(upperId_ % CHUNK_AREA),
        upperId_
    };*/

    for (size_t i = 0; i < itemsAllocatedCount_.size(); ++i) {
        if (itemsAllocatedCount_[i] < SECTORS_PER_CHUNK) {
            for (int j = 0; j < SECTORS_PER_CHUNK; ++j) {
                if (!items_[i]->allocated.test(j)) {
                    items_[i]->allocated.set(j);
                    ++itemsAllocatedCount_[i];
                    spdlog::debug("TilePool allocating sector {} at index {} (items size is {}).", i * SECTORS_PER_CHUNK + j, i, items_.size());
                    return i * SECTORS_PER_CHUNK + j;
                }
            }
        }
    }
    items_.emplace_back(details::make_unique<PoolItem>());
    items_.back()->allocated.set(0);
    itemsAllocatedCount_.push_back(1);
    spdlog::debug("TilePool allocating sector {} at end (items size is {}).", (items_.size() - 1) * SECTORS_PER_CHUNK, items_.size());
    return (items_.size() - 1) * SECTORS_PER_CHUNK;
}